

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

void src_float_to_short_array(float *in,short *out,int len)

{
  ulong uVar1;
  short sVar2;
  float fVar3;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      fVar3 = in[uVar1] * 32768.0;
      sVar2 = 0x7fff;
      if ((fVar3 < 32767.0) && (sVar2 = -0x8000, -32768.0 < fVar3)) {
        sVar2 = (short)(int)ROUND(fVar3);
      }
      out[uVar1] = sVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return;
}

Assistant:

void
src_float_to_short_array (const float *in, short *out, int len)
{
	for (int i = 0 ; i < len ; i++)
	{	float scaled_value ;
		scaled_value = in [i] * 32768.f ;
		if (scaled_value >= 32767.f)
			out [i] = 32767 ;
		else if (scaled_value <= -32768.f)
			out [i] = -32768 ;
		else
			out [i] = (short) (psf_lrintf (scaled_value)) ;
	}
}